

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ExtraBuilderInterfaces_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  java *local_18;
  Descriptor *descriptor_local;
  string *interfaces;
  
  local_19 = 0;
  local_18 = this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  __rhs = Descriptor::full_name_abi_cxx11_((Descriptor *)this);
  std::operator+(&local_40,"// @@protoc_insertion_point(builder_implements:",__rhs);
  std::operator+(__return_storage_ptr__,&local_40,")");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string ExtraBuilderInterfaces(const Descriptor* descriptor) {
  string interfaces = "// @@protoc_insertion_point(builder_implements:"
      + descriptor->full_name() + ")";
  return interfaces;
}